

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O0

QpAsmStatus
solveqp_actual(Instance *instance,Settings *settings,QpHotstartInformation *startinfo,
              Statistics *stats,QpModelStatus *status,QpSolution *solution,HighsTimer *qp_timer)

{
  QpModelStatus *in_R8;
  Basis basis;
  Quass quass;
  Runtime rt;
  Settings *in_stack_ffffffffffffea08;
  Basis *in_stack_ffffffffffffea10;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffea20;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffea58;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffea60;
  Statistics *in_stack_ffffffffffffea90;
  Instance *in_stack_ffffffffffffea98;
  Runtime *in_stack_ffffffffffffeaa0;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffeaa8;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffeab0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeb10;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_stack_ffffffffffffeb18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeb20;
  Runtime *in_stack_ffffffffffffeb28;
  Basis *in_stack_ffffffffffffeb30;
  HighsTimer *in_stack_fffffffffffff1a0;
  Basis *in_stack_fffffffffffff1a8;
  QpVector *in_stack_fffffffffffff1b0;
  QpVector *in_stack_fffffffffffff1b8;
  Quass *in_stack_fffffffffffff1c0;
  Quass local_a40 [3];
  Runtime local_a28;
  QpModelStatus *local_28;
  
  local_28 = in_R8;
  Runtime::Runtime(in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
  Settings::operator=((Settings *)in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
  Quass::Quass(local_a40,&local_a28);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea60,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea58);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea60,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea58);
  Basis::Basis(in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb20,
               in_stack_ffffffffffffeb18,in_stack_ffffffffffffeb10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea20);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::~vector(in_stack_ffffffffffffea20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea20);
  Quass::solve(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  *local_28 = local_a28.status;
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  QpVector::operator=((QpVector *)in_stack_ffffffffffffea10,(QpVector *)in_stack_ffffffffffffea08);
  QpVector::operator=((QpVector *)in_stack_ffffffffffffea10,(QpVector *)in_stack_ffffffffffffea08);
  QpVector::operator=((QpVector *)in_stack_ffffffffffffea10,(QpVector *)in_stack_ffffffffffffea08);
  QpVector::operator=((QpVector *)in_stack_ffffffffffffea10,(QpVector *)in_stack_ffffffffffffea08);
  Basis::~Basis(in_stack_ffffffffffffea10);
  Runtime::~Runtime((Runtime *)in_stack_ffffffffffffea10);
  return kOk;
}

Assistant:

QpAsmStatus solveqp_actual(Instance& instance, Settings& settings,
                           QpHotstartInformation& startinfo, Statistics& stats,
                           QpModelStatus& status, QpSolution& solution,
                           HighsTimer& qp_timer) {
  Runtime rt(instance, stats);
  rt.settings = settings;
  Quass quass(rt);

  Basis basis(rt, startinfo.active, startinfo.status, startinfo.inactive);

  quass.solve(startinfo.primal, startinfo.rowact, basis, qp_timer);

  status = rt.status;

  solution.status_var = rt.status_var;
  solution.status_con = rt.status_con;
  solution.primal = rt.primal;
  solution.dualvar = rt.dualvar;
  solution.rowactivity = rt.rowactivity;
  solution.dualcon = rt.dualcon;

  return QpAsmStatus::kOk;
}